

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subsequence_iterator.hpp
# Opt level: O1

void __thiscall
burst::subsequence_iterator<const_char_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
::subsequence_iterator
          (subsequence_iterator<const_char_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
           *this,char *first,char *last)

{
  pointer ppcVar1;
  __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_> _Var2;
  allocator_type local_19;
  
  this->m_begin = first;
  this->m_end = last;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            (&this->m_subsequence,(long)last - (long)first,&local_19);
  this->m_subsequence_size = 0;
  ppcVar1 = (this->m_subsequence).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  _Var2 = next_chain<__gnu_cxx::__normal_iterator<char_const**,std::vector<char_const*,std::allocator<char_const*>>>,char_const*,burst::next_subsequence<__gnu_cxx::__normal_iterator<char_const**,std::vector<char_const*,std::allocator<char_const*>>>,char_const*>(__gnu_cxx::__normal_iterator<char_const**,std::vector<char_const*,std::allocator<char_const*>>>,__gnu_cxx::__normal_iterator<char_const**,std::vector<char_const*,std::allocator<char_const*>>>,char_const*,char_const*)::_lambda(auto:1,(auto:2&&)___)_1_>
                    (ppcVar1,ppcVar1,this->m_begin,this->m_end);
  this->m_subsequence_size =
       (long)_Var2._M_current -
       (long)(this->m_subsequence).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
             _M_impl.super__Vector_impl_data._M_start >> 3;
  return;
}

Assistant:

subsequence_iterator (ForwardIterator first, ForwardIterator last):
            m_begin(std::move(first)),
            m_end(std::move(last)),
            m_subsequence(static_cast<std::size_t>(std::distance(m_begin, m_end))),
            m_subsequence_size(0)
        {
            increment();
        }